

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

bool __thiscall QShaderDescription::isValid(QShaderDescription *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = QList<QShaderDescription::InOutVariable>::isEmpty
                    ((QList<QShaderDescription::InOutVariable> *)0x6d8e12);
  local_9 = 1;
  if (bVar1) {
    bVar1 = QList<QShaderDescription::InOutVariable>::isEmpty
                      ((QList<QShaderDescription::InOutVariable> *)0x6d8e34);
    local_9 = 1;
    if (bVar1) {
      bVar1 = QList<QShaderDescription::UniformBlock>::isEmpty
                        ((QList<QShaderDescription::UniformBlock> *)0x6d8e56);
      local_9 = 1;
      if (bVar1) {
        bVar1 = QList<QShaderDescription::PushConstantBlock>::isEmpty
                          ((QList<QShaderDescription::PushConstantBlock> *)0x6d8e78);
        local_9 = 1;
        if (bVar1) {
          bVar1 = QList<QShaderDescription::StorageBlock>::isEmpty
                            ((QList<QShaderDescription::StorageBlock> *)0x6d8e9a);
          local_9 = 1;
          if (bVar1) {
            bVar1 = QList<QShaderDescription::InOutVariable>::isEmpty
                              ((QList<QShaderDescription::InOutVariable> *)0x6d8ebf);
            local_9 = 1;
            if (bVar1) {
              bVar1 = QList<QShaderDescription::InOutVariable>::isEmpty
                                ((QList<QShaderDescription::InOutVariable> *)0x6d8ee4);
              local_9 = 1;
              if (bVar1) {
                bVar1 = QList<QShaderDescription::InOutVariable>::isEmpty
                                  ((QList<QShaderDescription::InOutVariable> *)0x6d8f06);
                local_9 = 1;
                if (bVar1) {
                  bVar1 = QList<QShaderDescription::InOutVariable>::isEmpty
                                    ((QList<QShaderDescription::InOutVariable> *)0x6d8f28);
                  local_9 = 1;
                  if (bVar1) {
                    bVar1 = QList<QShaderDescription::BuiltinVariable>::isEmpty
                                      ((QList<QShaderDescription::BuiltinVariable> *)0x6d8f4a);
                    local_9 = 1;
                    if (bVar1) {
                      bVar1 = QList<QShaderDescription::BuiltinVariable>::isEmpty
                                        ((QList<QShaderDescription::BuiltinVariable> *)0x6d8f6c);
                      local_9 = bVar1 ^ 0xff;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool QShaderDescription::isValid() const
{
    return !d->inVars.isEmpty() || !d->outVars.isEmpty()
        || !d->uniformBlocks.isEmpty() || !d->pushConstantBlocks.isEmpty() || !d->storageBlocks.isEmpty()
        || !d->combinedImageSamplers.isEmpty() || !d->storageImages.isEmpty()
        || !d->separateImages.isEmpty() || !d->separateSamplers.isEmpty()
        || !d->inBuiltins.isEmpty() || !d->outBuiltins.isEmpty();
}